

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateRecorder::Impl::copy_specialization_info
          (Impl *this,VkSpecializationInfo *info,ScratchAllocator *alloc,
          VkSpecializationInfo **out_info)

{
  VkSpecializationMapEntry *pVVar1;
  void *pvVar2;
  uint32_t uVar3;
  undefined4 uVar4;
  VkSpecializationInfo *pVVar5;
  VkSpecializationMapEntry *__dest;
  void *__dest_00;
  ptrdiff_t _Num;
  size_t sVar6;
  
  pVVar5 = (VkSpecializationInfo *)ScratchAllocator::allocate_raw(alloc,0x20,0x10);
  if (pVVar5 != (VkSpecializationInfo *)0x0) {
    uVar3 = info->mapEntryCount;
    uVar4 = *(undefined4 *)&info->field_0x4;
    pVVar1 = info->pMapEntries;
    pvVar2 = info->pData;
    pVVar5->dataSize = info->dataSize;
    pVVar5->pData = pvVar2;
    pVVar5->mapEntryCount = uVar3;
    *(undefined4 *)&pVVar5->field_0x4 = uVar4;
    pVVar5->pMapEntries = pVVar1;
  }
  if ((ulong)pVVar5->mapEntryCount == 0) {
LAB_0012d20c:
    __dest = (VkSpecializationMapEntry *)0x0;
  }
  else {
    pVVar1 = pVVar5->pMapEntries;
    sVar6 = (ulong)pVVar5->mapEntryCount << 4;
    __dest = (VkSpecializationMapEntry *)ScratchAllocator::allocate_raw(alloc,sVar6,0x10);
    if (__dest == (VkSpecializationMapEntry *)0x0) goto LAB_0012d20c;
    memmove(__dest,pVVar1,sVar6);
  }
  pVVar5->pMapEntries = __dest;
  sVar6 = pVVar5->dataSize;
  if (sVar6 != 0) {
    pvVar2 = pVVar5->pData;
    __dest_00 = ScratchAllocator::allocate_raw(alloc,sVar6,0x10);
    if (__dest_00 != (void *)0x0) {
      memmove(__dest_00,pvVar2,sVar6);
      goto LAB_0012d24b;
    }
  }
  __dest_00 = (void *)0x0;
LAB_0012d24b:
  pVVar5->pData = __dest_00;
  *out_info = pVVar5;
  return true;
}

Assistant:

bool StateRecorder::Impl::copy_specialization_info(const VkSpecializationInfo *info, ScratchAllocator &alloc,
                                                   const VkSpecializationInfo **out_info)
{
	auto *ret = copy(info, 1, alloc);
	ret->pMapEntries = copy(ret->pMapEntries, ret->mapEntryCount, alloc);
	ret->pData = copy(static_cast<const uint8_t *>(ret->pData), ret->dataSize, alloc);

	*out_info = ret;
	return true;
}